

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O1

CrossIdBinsSelectExpr * __thiscall
slang::BumpAllocator::emplace<slang::ast::CrossIdBinsSelectExpr>(BumpAllocator *this)

{
  CrossIdBinsSelectExpr *pCVar1;
  
  pCVar1 = (CrossIdBinsSelectExpr *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((CrossIdBinsSelectExpr *)this->endPtr < pCVar1 + 1) {
    pCVar1 = (CrossIdBinsSelectExpr *)allocateSlow(this,0x10,8);
  }
  else {
    this->head->current = (byte *)(pCVar1 + 1);
  }
  (pCVar1->super_BinsSelectExpr).kind = CrossId;
  (pCVar1->super_BinsSelectExpr).syntax = (SyntaxNode *)0x0;
  return pCVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }